

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int nghttp2_session_on_settings_received(nghttp2_session *session,nghttp2_frame *frame,int noack)

{
  uint uVar1;
  uint uVar2;
  nghttp2_settings_entry *pnVar3;
  nghttp2_inflight_settings *ptr;
  nghttp2_on_frame_recv_callback p_Var4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  nghttp2_session *local_40;
  uint32_t local_38;
  uint32_t local_34;
  
  if ((frame->hd).stream_id == 0) {
    if (((frame->hd).flags & 1) == 0) {
      if (session->remote_settings_received == '\0') {
        (session->remote_settings).max_concurrent_streams = 0xffffffff;
        session->remote_settings_received = '\x01';
      }
      if ((frame->data).padlen != 0) {
        uVar7 = 0;
        do {
          pnVar3 = (frame->settings).iv;
          switch(pnVar3[uVar7].settings_id) {
          case 1:
            iVar5 = nghttp2_hd_deflate_change_table_size
                              (&session->hd_deflater,(ulong)pnVar3[uVar7].value);
            if (iVar5 != 0) {
              if (iVar5 < -900) {
                return iVar5;
              }
              iVar5 = -0x20b;
              goto LAB_0010d1b3;
            }
            (session->remote_settings).header_table_size = pnVar3[uVar7].value;
            break;
          case 2:
            uVar1 = pnVar3[uVar7].value;
            if (uVar1 < 2) {
              if ((uVar1 == 0) || (session->server != '\0')) {
                (session->remote_settings).enable_push = uVar1;
                break;
              }
              pcVar6 = "SETTINGS: server attempted to enable push";
            }
            else {
              pcVar6 = "SETTINGS: invalid SETTINGS_ENBLE_PUSH";
            }
            goto LAB_0010d1be;
          case 3:
            (session->remote_settings).max_concurrent_streams = pnVar3[uVar7].value;
            break;
          case 4:
            if ((int)pnVar3[uVar7].value < 0) {
              pcVar6 = "SETTINGS: too large SETTINGS_INITIAL_WINDOW_SIZE";
              iVar5 = -0x20c;
              goto LAB_0010d1c9;
            }
            local_34 = (session->remote_settings).initial_window_size;
            local_40 = session;
            local_38 = pnVar3[uVar7].value;
            iVar5 = nghttp2_map_each(&session->streams,update_remote_initial_window_size_func,
                                     &local_40);
            if (iVar5 < -900) {
              return iVar5;
            }
            if (iVar5 != 0) {
              iVar5 = -0x20c;
              goto LAB_0010d1b3;
            }
            (session->remote_settings).initial_window_size = pnVar3[uVar7].value;
            break;
          case 5:
            if (pnVar3[uVar7].value - 0x1000000 < 0xff004000) {
              pcVar6 = "SETTINGS: invalid SETTINGS_MAX_FRAME_SIZE";
              goto LAB_0010d1be;
            }
            (session->remote_settings).max_frame_size = pnVar3[uVar7].value;
            break;
          case 6:
            (session->remote_settings).max_header_list_size = pnVar3[uVar7].value;
            break;
          case 8:
            uVar1 = pnVar3[uVar7].value;
            if (uVar1 < 2) {
              if (((session->server != '\0') || (uVar1 != 0)) ||
                 ((session->remote_settings).enable_connect_protocol == 0)) {
                (session->remote_settings).enable_connect_protocol = uVar1;
                break;
              }
              pcVar6 = "SETTINGS: server attempted to disable SETTINGS_ENABLE_CONNECT_PROTOCOL";
            }
            else {
              pcVar6 = "SETTINGS: invalid SETTINGS_ENABLE_CONNECT_PROTOCOL";
            }
            goto LAB_0010d1be;
          case 9:
            uVar1 = pnVar3[uVar7].value;
            if (uVar1 < 2) {
              uVar2 = (session->remote_settings).no_rfc7540_priorities;
              if ((uVar2 == 0xffffffff) || (uVar2 == uVar1)) {
                (session->remote_settings).no_rfc7540_priorities = uVar1;
                break;
              }
              pcVar6 = "SETTINGS: SETTINGS_NO_RFC7540_PRIORITIES cannot be changed";
            }
            else {
              pcVar6 = "SETTINGS: invalid SETTINGS_NO_RFC7540_PRIORITIES";
            }
LAB_0010d1be:
            iVar5 = -0x1f9;
            goto LAB_0010d1c9;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < (frame->data).padlen);
      }
      if ((((session->remote_settings).no_rfc7540_priorities == 0xffffffff) &&
          ((session->remote_settings).no_rfc7540_priorities = 0, session->server != '\0')) &&
         ((session->pending_no_rfc7540_priorities != '\0' && ((session->opt_flags & 0x20) != 0)))) {
        session->fallback_rfc7540_priorities = '\x01';
      }
      if (((noack == 0) && (iVar5 = session_is_closing(session), iVar5 == 0)) &&
         (iVar5 = nghttp2_session_add_settings(session,'\x01',(nghttp2_settings_entry *)0x0,0),
         iVar5 != 0)) {
        if (iVar5 < -900) {
          return iVar5;
        }
        iVar5 = -0x216;
LAB_0010d1b3:
        pcVar6 = (char *)0x0;
LAB_0010d1c9:
        iVar5 = session_handle_invalid_connection(session,frame,iVar5,pcVar6);
        return iVar5;
      }
LAB_0010d0c4:
      p_Var4 = (session->callbacks).on_frame_recv_callback;
      if ((p_Var4 != (nghttp2_on_frame_recv_callback)0x0) &&
         (iVar5 = (*p_Var4)(session,frame,session->user_data), iVar5 != 0)) {
        return -0x386;
      }
      return 0;
    }
    if ((frame->data).padlen != 0) {
      pcVar6 = "SETTINGS: ACK and payload != 0";
      iVar5 = -0x20a;
      goto LAB_0010ce01;
    }
    ptr = session->inflight_settings_head;
    if (ptr != (nghttp2_inflight_settings *)0x0) {
      iVar5 = nghttp2_session_update_local_settings(session,ptr->iv,ptr->niv);
      session->inflight_settings_head = ptr->next;
      nghttp2_mem_free(&session->mem,ptr->iv);
      nghttp2_mem_free(&session->mem,ptr);
      if (iVar5 == 0) goto LAB_0010d0c4;
      if (iVar5 < -900) {
        return iVar5;
      }
      pcVar6 = (char *)0x0;
      goto LAB_0010ce01;
    }
    pcVar6 = "SETTINGS: unexpected ACK";
  }
  else {
    pcVar6 = "SETTINGS: stream_id != 0";
  }
  iVar5 = -0x1f9;
LAB_0010ce01:
  iVar5 = session_handle_invalid_connection(session,frame,iVar5,pcVar6);
  return iVar5;
}

Assistant:

int nghttp2_session_on_settings_received(nghttp2_session *session,
                                         nghttp2_frame *frame, int noack) {
  int rv;
  size_t i;
  nghttp2_mem *mem;
  nghttp2_inflight_settings *settings;

  mem = &session->mem;

  if (frame->hd.stream_id != 0) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "SETTINGS: stream_id != 0");
  }
  if (frame->hd.flags & NGHTTP2_FLAG_ACK) {
    if (frame->settings.niv != 0) {
      return session_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_FRAME_SIZE_ERROR,
        "SETTINGS: ACK and payload != 0");
    }

    settings = session->inflight_settings_head;

    if (!settings) {
      return session_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_PROTO, "SETTINGS: unexpected ACK");
    }

    rv = nghttp2_session_update_local_settings(session, settings->iv,
                                               settings->niv);

    session->inflight_settings_head = settings->next;

    inflight_settings_del(settings, mem);

    if (rv != 0) {
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }
      return session_handle_invalid_connection(session, frame, rv, NULL);
    }
    return session_call_on_frame_received(session, frame);
  }

  if (!session->remote_settings_received) {
    session->remote_settings.max_concurrent_streams =
      NGHTTP2_DEFAULT_MAX_CONCURRENT_STREAMS;
    session->remote_settings_received = 1;
  }

  for (i = 0; i < frame->settings.niv; ++i) {
    nghttp2_settings_entry *entry = &frame->settings.iv[i];

    switch (entry->settings_id) {
    case NGHTTP2_SETTINGS_HEADER_TABLE_SIZE:

      rv = nghttp2_hd_deflate_change_table_size(&session->hd_deflater,
                                                entry->value);
      if (rv != 0) {
        if (nghttp2_is_fatal(rv)) {
          return rv;
        } else {
          return session_handle_invalid_connection(
            session, frame, NGHTTP2_ERR_HEADER_COMP, NULL);
        }
      }

      session->remote_settings.header_table_size = entry->value;

      break;
    case NGHTTP2_SETTINGS_ENABLE_PUSH:

      if (entry->value != 0 && entry->value != 1) {
        return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_PROTO,
          "SETTINGS: invalid SETTINGS_ENBLE_PUSH");
      }

      if (!session->server && entry->value != 0) {
        return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_PROTO,
          "SETTINGS: server attempted to enable push");
      }

      session->remote_settings.enable_push = entry->value;

      break;
    case NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS:

      session->remote_settings.max_concurrent_streams = entry->value;

      break;
    case NGHTTP2_SETTINGS_INITIAL_WINDOW_SIZE:

      /* Update the initial window size of the all active streams */
      /* Check that initial_window_size < (1u << 31) */
      if (entry->value > NGHTTP2_MAX_WINDOW_SIZE) {
        return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_FLOW_CONTROL,
          "SETTINGS: too large SETTINGS_INITIAL_WINDOW_SIZE");
      }

      rv = session_update_remote_initial_window_size(session,
                                                     (int32_t)entry->value);

      if (nghttp2_is_fatal(rv)) {
        return rv;
      }

      if (rv != 0) {
        return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_FLOW_CONTROL, NULL);
      }

      session->remote_settings.initial_window_size = entry->value;

      break;
    case NGHTTP2_SETTINGS_MAX_FRAME_SIZE:

      if (entry->value < NGHTTP2_MAX_FRAME_SIZE_MIN ||
          entry->value > NGHTTP2_MAX_FRAME_SIZE_MAX) {
        return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_PROTO,
          "SETTINGS: invalid SETTINGS_MAX_FRAME_SIZE");
      }

      session->remote_settings.max_frame_size = entry->value;

      break;
    case NGHTTP2_SETTINGS_MAX_HEADER_LIST_SIZE:

      session->remote_settings.max_header_list_size = entry->value;

      break;
    case NGHTTP2_SETTINGS_ENABLE_CONNECT_PROTOCOL:

      if (entry->value != 0 && entry->value != 1) {
        return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_PROTO,
          "SETTINGS: invalid SETTINGS_ENABLE_CONNECT_PROTOCOL");
      }

      if (!session->server &&
          session->remote_settings.enable_connect_protocol &&
          entry->value == 0) {
        return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_PROTO,
          "SETTINGS: server attempted to disable "
          "SETTINGS_ENABLE_CONNECT_PROTOCOL");
      }

      session->remote_settings.enable_connect_protocol = entry->value;

      break;
    case NGHTTP2_SETTINGS_NO_RFC7540_PRIORITIES:

      if (entry->value != 0 && entry->value != 1) {
        return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_PROTO,
          "SETTINGS: invalid SETTINGS_NO_RFC7540_PRIORITIES");
      }

      if (session->remote_settings.no_rfc7540_priorities != UINT32_MAX &&
          session->remote_settings.no_rfc7540_priorities != entry->value) {
        return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_PROTO,
          "SETTINGS: SETTINGS_NO_RFC7540_PRIORITIES cannot be changed");
      }

      session->remote_settings.no_rfc7540_priorities = entry->value;

      break;
    }
  }

  if (session->remote_settings.no_rfc7540_priorities == UINT32_MAX) {
    session->remote_settings.no_rfc7540_priorities = 0;

    if (session->server && session->pending_no_rfc7540_priorities &&
        (session->opt_flags &
         NGHTTP2_OPTMASK_SERVER_FALLBACK_RFC7540_PRIORITIES)) {
      session->fallback_rfc7540_priorities = 1;
    }
  }

  if (!noack && !session_is_closing(session)) {
    rv = nghttp2_session_add_settings(session, NGHTTP2_FLAG_ACK, NULL, 0);

    if (rv != 0) {
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }

      return session_handle_invalid_connection(session, frame,
                                               NGHTTP2_ERR_INTERNAL, NULL);
    }
  }

  return session_call_on_frame_received(session, frame);
}